

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_split(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  int32_t iVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  Value local_118;
  Value local_108;
  String local_f8;
  Value local_e8;
  size_t local_d8;
  long nextPos;
  long posB;
  ValueList result;
  undefined1 local_a8 [24];
  long maxCount;
  undefined1 local_80 [24];
  String delim;
  String local_50;
  undefined1 local_40 [24];
  String self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  self._8_8_ = partialResult;
  String::String(&local_50,"self");
  Context::GetVar((Context *)local_40,(String *)context,(LocalOnlyMode)&local_50);
  Value::ToString((Value *)(local_40 + 0x10),(Machine *)local_40);
  Value::~Value((Value *)local_40);
  String::~String(&local_50);
  String::String((String *)&maxCount,"delimiter");
  Context::GetVar((Context *)local_80,(String *)context,(LocalOnlyMode)&maxCount);
  Value::ToString((Value *)(local_80 + 0x10),(Machine *)local_80);
  Value::~Value((Value *)local_80);
  String::~String((String *)&maxCount);
  String::String((String *)&result.isTemp,"maxCount");
  Context::GetVar((Context *)local_a8,(String *)context,(char)&result + 8);
  iVar2 = Value::IntValue((Value *)local_a8);
  Value::~Value((Value *)local_a8);
  String::~String((String *)&result.isTemp);
  local_a8._16_8_ = (long)iVar2;
  List<MiniScript::Value>::List((List<MiniScript::Value> *)&posB,0);
  nextPos = 0;
  while (lVar4 = nextPos, sVar3 = String::LengthB((String *)(local_40 + 0x10)), (ulong)lVar4 < sVar3
        ) {
    if (((long)local_a8._16_8_ < 0) ||
       (lVar4 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&posB),
       lVar4 != local_a8._16_8_ + -1)) {
      bVar1 = String::empty((String *)(local_80 + 0x10));
      if (bVar1) {
        local_d8 = nextPos + 1;
      }
      else {
        local_d8 = String::IndexOfB((String *)(local_40 + 0x10),(String *)(local_80 + 0x10),nextPos)
        ;
      }
    }
    else {
      local_d8 = String::LengthB((String *)(local_40 + 0x10));
    }
    if ((long)local_d8 < 0) {
      local_d8 = String::LengthB((String *)(local_40 + 0x10));
    }
    String::SubstringB(&local_f8,(long)(local_40 + 0x10),nextPos);
    Value::Value(&local_e8,&local_f8);
    List<MiniScript::Value>::Add((List<MiniScript::Value> *)&posB,&local_e8);
    Value::~Value(&local_e8);
    String::~String(&local_f8);
    sVar3 = local_d8;
    sVar5 = String::LengthB((String *)(local_80 + 0x10));
    nextPos = sVar3 + sVar5;
    sVar6 = String::LengthB((String *)(local_40 + 0x10));
    if ((sVar3 + sVar5 == sVar6) && (bVar1 = String::empty((String *)(local_80 + 0x10)), !bVar1)) {
      Value::Value(&local_108,(Value *)Value::emptyString);
      List<MiniScript::Value>::Add((List<MiniScript::Value> *)&posB,&local_108);
      Value::~Value(&local_108);
    }
  }
  Value::Value(&local_118,(ValueList *)&posB);
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_118,true);
  Value::~Value(&local_118);
  List<MiniScript::Value>::~List((List<MiniScript::Value> *)&posB);
  String::~String((String *)(local_80 + 0x10));
  String::~String((String *)(local_40 + 0x10));
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_split(Context *context, IntrinsicResult partialResult) {
		String self = context->GetVar("self").ToString();
		String delim = context->GetVar("delimiter").ToString();
		long maxCount = context->GetVar("maxCount").IntValue();
		ValueList result;
		long posB = 0;
		while (posB < self.LengthB()) {
			long nextPos;
			if (maxCount >= 0 and result.Count() == maxCount - 1) nextPos = self.LengthB();
			else if (delim.empty()) nextPos = posB + 1;
			else nextPos = self.IndexOfB(delim, posB);
			if (nextPos < 0) nextPos = self.LengthB();
			result.Add(self.SubstringB(posB, nextPos - posB));
			posB = nextPos + delim.LengthB();
			if (posB == self.LengthB() && !delim.empty()) result.Add(Value::emptyString);
		}
		return IntrinsicResult(result);
	}